

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTxOut::ConfidentialTxOut
          (ConfidentialTxOut *this,ConfidentialAssetId *asset,ConfidentialValue *confidential_value)

{
  AbstractTxOut::AbstractTxOut(&this->super_AbstractTxOut);
  (this->super_AbstractTxOut)._vptr_AbstractTxOut = (_func_int **)&PTR__ConfidentialTxOut_007fc908;
  ConfidentialAssetId::ConfidentialAssetId(&this->asset_,asset);
  ConfidentialValue::ConfidentialValue(&this->confidential_value_,confidential_value);
  (this->nonce_)._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_007f6a20;
  ByteData::ByteData(&(this->nonce_).data_);
  (this->nonce_).version_ = '\0';
  ByteData::ByteData(&this->surjection_proof_);
  ByteData::ByteData(&this->range_proof_);
  return;
}

Assistant:

ConfidentialTxOut::ConfidentialTxOut(
    const ConfidentialAssetId &asset,
    const ConfidentialValue &confidential_value)
    : AbstractTxOut(),
      asset_(asset),
      confidential_value_(confidential_value),
      nonce_(),
      surjection_proof_(),
      range_proof_() {
  // do nothing
}